

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

void __thiscall IR::LabelInstr::RemoveLabelRef(LabelInstr *this,BranchInstr *branchRef)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar1;
  SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *buffer;
  bool bVar2;
  Type *ppBVar3;
  undefined4 *puVar4;
  undefined1 local_30 [8];
  EditingIterator iter;
  
  local_30 = (undefined1  [8])&this->labelRefs;
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)local_30;
  do {
    bVar2 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)local_30);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x661,"((0))","Branch not found on labelRef list");
      if (bVar2) {
        *puVar4 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    ppBVar3 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_30);
    buffer = iter.super_EditingIterator.super_Iterator.list;
  } while (*ppBVar3 != branchRef);
  this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
            (((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
             ((long)local_30 + 0x10))->super_SListNodeBase<Memory::ArenaAllocator>).next;
  SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
  UnlinkCurrentNode((EditingIterator *)local_30);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (this_00,buffer,0x10);
  return;
}

Assistant:

void
LabelInstr::RemoveLabelRef(BranchInstr *branchRef)
{
    FOREACH_SLISTCOUNTED_ENTRY_EDITING(BranchInstr*, branchEntry, &this->labelRefs, iter)
    {
        if (branchEntry == branchRef)
        {
            iter.RemoveCurrent();
            return;
        }
    } NEXT_SLISTCOUNTED_ENTRY_EDITING;

    AssertMsg(UNREACHED, "Branch not found on labelRef list");
}